

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Mat *pMVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  undefined4 *puVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  int k;
  ulong uVar29;
  int iVar30;
  ulong __n;
  float *pfVar31;
  bool bVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar45 [12];
  undefined1 auVar43 [16];
  undefined1 auVar46 [12];
  vector<int,_std::allocator<int>_> _space_ofs;
  long local_1c0;
  allocator_type local_1b1;
  ulong local_1b0;
  ulong local_1a8;
  int local_19c;
  Mat local_198;
  ulong local_150;
  void *local_148;
  ulong local_140;
  Mat *local_138;
  ulong local_130;
  long local_128;
  int local_120;
  uint local_11c;
  undefined1 local_118 [16];
  Mat local_108;
  undefined1 local_b8 [16];
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  Option local_78;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  
  iVar25 = bottom_blob->c;
  if (iVar25 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar23 = this->kernel_w;
  iVar30 = this->dilation_w;
  iVar20 = this->kernel_h;
  iVar16 = this->dilation_h;
  sVar5 = bottom_blob->elemsize;
  local_108.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_108.refcount._0_4_ = SUB84(piVar6,0);
  local_108.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_108.elemsize._0_4_ = (undefined4)sVar5;
  local_108.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
  local_108.elempack = bottom_blob->elempack;
  local_108.allocator = bottom_blob->allocator;
  local_108.dims = bottom_blob->dims;
  local_108.w = bottom_blob->w;
  local_108.h = bottom_blob->h;
  local_108.d = bottom_blob->d;
  local_108.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_138 = top_blob;
  local_108.c = iVar25;
  if (sVar5 != 1) {
    uVar22 = (long)iVar25 / (long)this->group;
    local_198.cstep = 0;
    local_198.data = (undefined4 *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,iVar25,4,(Allocator *)0x0);
    iVar4 = this->group;
    if (0 < (long)iVar4) {
      pvVar7 = (this->bottom_blob_int8_scales).data;
      lVar26 = 0;
      puVar21 = (undefined4 *)local_198.data;
      do {
        if (0 < (int)uVar22) {
          uVar1 = *(undefined4 *)((long)pvVar7 + lVar26 * 4);
          uVar24 = uVar22 & 0xffffffff;
          do {
            *puVar21 = uVar1;
            puVar21 = puVar21 + 1;
            uVar27 = (int)uVar24 - 1;
            uVar24 = (ulong)uVar27;
          } while (uVar27 != 0);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != iVar4);
    }
    local_78._0_8_ = *(undefined8 *)opt;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    local_78.use_bf16_storage = opt->use_bf16_storage;
    local_78.use_fp16_packed = opt->use_fp16_packed;
    local_78.use_fp16_storage = opt->use_fp16_storage;
    local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_78.use_int8_packed = opt->use_int8_packed;
    local_78.use_int8_storage = opt->use_int8_storage;
    local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_78.use_packing_layout = opt->use_packing_layout;
    local_78.vulkan_device_index = opt->vulkan_device_index;
    local_78.use_reserved_1 = opt->use_reserved_1;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_reserved_2 = opt->use_reserved_2;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_shader_local_memory = opt->use_shader_local_memory;
    local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_78.use_fp16_uniform = opt->use_fp16_uniform;
    local_78.use_int8_uniform = opt->use_int8_uniform;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_108,&local_198,&local_78);
    piVar6 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_198.data != (undefined4 *)0x0) {
            free(local_198.data);
          }
        }
        else {
          (**(code **)(*(long *)local_198.allocator + 0x18))();
        }
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  make_padding(this,&local_108,&local_198,this->kernel_w,this->kernel_h,opt);
  iVar4 = local_198.w;
  iVar19 = -100;
  if ((local_198.data == (void *)0x0) || ((long)local_198.c * local_198.cstep == 0))
  goto LAB_003f7a69;
  uVar22 = (long)(~((iVar23 + -1) * iVar30) + local_198.w) / (long)this->stride_w;
  uVar24 = (long)(~((iVar20 + -1) * iVar16) + local_198.h) / (long)this->stride_h;
  __n = (long)this->kernel_h * (long)this->kernel_w;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_78,__n,&local_1b1);
  uVar14 = local_78._0_8_;
  pMVar12 = local_138;
  if (0 < this->kernel_h) {
    iVar23 = this->dilation_h;
    iVar30 = this->dilation_w;
    iVar20 = this->kernel_w;
    iVar16 = 0;
    iVar19 = 0;
    iVar28 = 0;
    do {
      if (0 < this->kernel_w) {
        lVar26 = 0;
        do {
          *(int *)(local_78._0_8_ + (iVar16 + lVar26) * 4) = iVar19;
          iVar19 = iVar19 + this->dilation_w;
          lVar26 = lVar26 + 1;
        } while ((int)lVar26 < this->kernel_w);
        iVar16 = iVar16 + (int)lVar26;
      }
      iVar19 = iVar19 + (iVar4 * iVar23 - iVar30 * iVar20);
      iVar28 = iVar28 + 1;
    } while (iVar28 < this->kernel_h);
  }
  local_19c = this->int8_scale_term;
  local_150 = uVar24 & 0xffffffff;
  local_140 = uVar22 & 0xffffffff;
  Mat::create(local_138,(int)uVar22 + 1,(int)uVar24 + 1,this->num_output,
              (ulong)(local_19c < 0x65) * 3 + 1,opt->blob_allocator);
  iVar19 = -100;
  if ((pMVar12->data != (void *)0x0) && ((long)pMVar12->c * pMVar12->cstep != 0)) {
    iVar23 = this->group;
    iVar30 = (int)__n;
    if (iVar23 == this->num_output && iVar25 == iVar23) {
      if (this->group < 1) {
LAB_003f7a45:
        iVar19 = 0;
        goto LAB_003f7a47;
      }
      local_1b0 = (ulong)iVar30;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_118._8_8_;
      local_118 = auVar11 << 0x40;
      lVar26 = 0;
      uVar22 = local_150;
      do {
        if (-1 < (int)uVar22) {
          local_148 = (void *)(local_198.cstep * lVar26 *
                               CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) +
                              (long)local_198.data);
          pfVar31 = (float *)(local_138->cstep * lVar26 * local_138->elemsize +
                             (long)local_138->data);
          local_128 = (long)local_198.w *
                      CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          pvVar7 = (this->weight_data).data;
          uVar13 = local_118._0_8_;
          local_1a8 = 0;
          do {
            if (-1 < (int)local_140) {
              lVar17 = (long)(int)local_1a8;
              iVar25 = 0;
              do {
                auVar37 = ZEXT812(0);
                fVar34 = 0.0;
                if (0 < iVar30) {
                  uVar22 = 0;
                  iVar23 = 0;
                  do {
                    iVar23 = iVar23 + (int)*(char *)((long)pvVar7 + uVar22 + uVar13) *
                                      (int)*(char *)((long)local_148 +
                                                    (long)*(int *)(uVar14 + uVar22 * 4) +
                                                    this->stride_h * lVar17 * local_128 +
                                                    (long)iVar25 * (long)this->stride_w);
                    uVar22 = uVar22 + 1;
                  } while ((__n & 0xffffffff) != uVar22);
                  fVar34 = (float)iVar23;
                }
                fVar35 = *(float *)((long)(this->weight_data_int8_scales).data + lVar26 * 4);
                if (fVar35 != 0.0) {
                  auVar37._4_8_ = 0;
                  auVar37._0_4_ =
                       1.0 / (fVar35 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                 lVar26 * 4));
                }
                uVar22 = auVar37._4_8_;
                fVar34 = auVar37._0_4_ * fVar34;
                if (this->bias_term != 0) {
                  fVar34 = fVar34 + *(float *)((long)(this->bias_data).data + lVar26 * 4);
                }
                auVar38._4_8_ = uVar22;
                auVar38._0_4_ = fVar34;
                auVar41._12_4_ = 0;
                auVar41._0_12_ = auVar38;
                if (this->activation_type - 1U < 6) {
                  auVar45._8_4_ = 0;
                  auVar45._0_8_ = uVar22;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar34 <= 0.0) {
                      auVar9._12_4_ = 0;
                      auVar9._0_12_ = auVar45;
                      auVar41 = auVar9 << 0x20;
                    }
                    goto LAB_003f73ff;
                  case 2:
                    fVar35 = (float)(~-(uint)(0.0 < fVar34) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar34) & 0x3f800000) * fVar34;
                    break;
                  case 3:
                    pfVar8 = (float *)(this->activation_params).data;
                    fVar35 = *pfVar8;
                    if (fVar34 <= fVar35) {
                      auVar41._4_8_ = uVar22;
                      auVar41._0_4_ = fVar35;
                      auVar41._12_4_ = 0;
                    }
                    fVar35 = pfVar8[1];
                    if (auVar41._0_4_ <= fVar35) {
                      fVar35 = auVar41._0_4_;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar34) {
                      auVar42._4_12_ = auVar45;
                      auVar42._0_4_ = 0x42b0c0a5;
                      auVar38 = auVar42._0_12_;
                    }
                    uVar27 = -(uint)(auVar38._0_4_ < -88.37626);
                    fVar34 = expf((float)(uVar27 & 0x42b0c0a5 | ~uVar27 & (uint)-auVar38._0_4_));
                    fVar35 = 1.0 / (fVar34 + 1.0);
                    break;
                  case 5:
                    local_b8 = auVar41;
                    fVar34 = expf(fVar34);
                    fVar34 = logf(fVar34 + 1.0);
                    fVar34 = tanhf(fVar34);
                    fVar35 = fVar34 * (float)local_b8._0_4_;
                    break;
                  case 6:
                    pfVar8 = (float *)(this->activation_params).data;
                    fVar2 = *pfVar8;
                    fVar3 = pfVar8[1];
                    fVar36 = -fVar3 / fVar2;
                    fVar35 = 0.0;
                    if (fVar36 <= fVar34) {
                      if (fVar36 + 1.0 / fVar2 < fVar34) goto LAB_003f73ff;
                      fVar35 = (fVar2 * fVar34 + fVar3) * fVar34;
                    }
                  }
                }
                else {
LAB_003f73ff:
                  fVar35 = auVar41._0_4_;
                }
                if (local_19c < 0x65) {
                  *pfVar31 = fVar35;
                  lVar18 = 4;
                }
                else {
                  fVar34 = roundf(fVar35 * *(float *)((long)(this->top_blob_int8_scales).data +
                                                     lVar26 * 4));
                  iVar23 = (int)fVar34;
                  if (iVar23 < -0x7e) {
                    iVar23 = -0x7f;
                  }
                  uVar15 = (undefined1)iVar23;
                  if (0x7e < iVar23) {
                    uVar15 = 0x7f;
                  }
                  *(undefined1 *)pfVar31 = uVar15;
                  lVar18 = 1;
                }
                pfVar31 = (float *)((long)pfVar31 + lVar18);
                bVar32 = iVar25 != (int)local_140;
                iVar25 = iVar25 + 1;
              } while (bVar32);
            }
            iVar25 = (int)local_1a8;
            local_1a8 = (ulong)(iVar25 + 1);
            uVar22 = local_150;
          } while (iVar25 != (int)local_150);
        }
        lVar26 = lVar26 + 1;
        local_118._0_8_ = local_118._0_8_ + local_1b0;
      } while (lVar26 < this->group);
    }
    else {
      uVar22 = (long)this->num_output / (long)iVar23;
      uVar24 = uVar22 & 0xffffffff;
      if (this->group < 1) goto LAB_003f7a45;
      iVar16 = (int)((long)iVar25 / (long)iVar23);
      iVar20 = iVar16 * iVar30;
      local_11c = (uint)uVar22;
      local_120 = local_11c * iVar20;
      local_98 = (long)iVar20;
      local_a0 = (long)(int)local_11c;
      local_80 = uVar22 & 0xffffffff;
      local_148 = (void *)CONCAT44(local_148._4_4_,iVar16);
      local_1c0 = 0;
      do {
        if (0 < (int)uVar24) {
          local_88 = local_1c0 * local_a0;
          local_90 = (long)(local_120 * (int)local_1c0);
          uVar27 = (int)local_148 * (int)local_1c0;
          local_130 = 0;
          do {
            if (-1 < (int)local_150) {
              local_b8._0_8_ = local_130 + local_88;
              pfVar31 = (float *)(local_138->cstep * (local_130 + local_88) * local_138->elemsize +
                                 (long)local_138->data);
              local_1a8 = (long)(this->weight_data).data + local_130 * local_98 + local_90;
              local_1b0 = 0;
              do {
                if (-1 < (int)local_140) {
                  local_128 = (long)(int)local_1b0;
                  iVar20 = 0;
                  do {
                    auVar39 = ZEXT812(0);
                    fVar34 = 0.0;
                    if (0 < (int)local_148) {
                      uVar24 = 0;
                      iVar16 = 0;
                      uVar22 = local_1a8;
                      do {
                        if (0 < iVar30) {
                          uVar29 = 0;
                          do {
                            iVar16 = iVar16 + (int)*(char *)(uVar22 + uVar29) *
                                              (int)*(char *)((long)local_198.data +
                                                            (long)*(int *)(uVar14 + uVar29 * 4) +
                                                            (uVar24 + uVar27) *
                                                            local_198.cstep *
                                                            CONCAT44(local_198.elemsize._4_4_,
                                                                     (undefined4)local_198.elemsize)
                                                            + (long)iVar20 * (long)this->stride_w +
                                                              (long)local_198.w *
                                                              CONCAT44(local_198.elemsize._4_4_,
                                                                       (undefined4)
                                                                       local_198.elemsize) *
                                                              this->stride_h * local_128);
                            uVar29 = uVar29 + 1;
                          } while ((__n & 0xffffffff) != uVar29);
                        }
                        uVar22 = uVar22 + __n;
                        uVar24 = uVar24 + 1;
                      } while (uVar24 != ((long)iVar25 / (long)iVar23 & 0xffffffffU));
                      fVar34 = (float)iVar16;
                    }
                    fVar35 = *(float *)((long)(this->weight_data_int8_scales).data + local_1c0 * 4);
                    if (fVar35 != 0.0) {
                      auVar39._4_8_ = 0;
                      auVar39._0_4_ =
                           1.0 / (fVar35 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                     local_1c0 * 4));
                    }
                    uVar22 = auVar39._4_8_;
                    fVar34 = auVar39._0_4_ * fVar34;
                    if (this->bias_term != 0) {
                      fVar34 = fVar34 + *(float *)((long)(this->bias_data).data + local_b8._0_8_ * 4
                                                  );
                    }
                    auVar40._4_8_ = uVar22;
                    auVar40._0_4_ = fVar34;
                    auVar43._12_4_ = 0;
                    auVar43._0_12_ = auVar40;
                    if (this->activation_type - 1U < 6) {
                      auVar46._8_4_ = 0;
                      auVar46._0_8_ = uVar22;
                      switch(this->activation_type) {
                      case 1:
                        if (fVar34 <= 0.0) {
                          auVar10._12_4_ = 0;
                          auVar10._0_12_ = auVar46;
                          auVar43 = auVar10 << 0x20;
                        }
                        goto LAB_003f7847;
                      case 2:
                        fVar35 = (float)(~-(uint)(0.0 < fVar34) & *(this->activation_params).data |
                                        -(uint)(0.0 < fVar34) & 0x3f800000) * fVar34;
                        break;
                      case 3:
                        pfVar8 = (float *)(this->activation_params).data;
                        fVar35 = *pfVar8;
                        if (fVar34 <= fVar35) {
                          auVar43._4_8_ = uVar22;
                          auVar43._0_4_ = fVar35;
                          auVar43._12_4_ = 0;
                        }
                        fVar35 = pfVar8[1];
                        if (auVar43._0_4_ <= fVar35) {
                          fVar35 = auVar43._0_4_;
                        }
                        break;
                      case 4:
                        if (88.37626 <= fVar34) {
                          auVar44._4_12_ = auVar46;
                          auVar44._0_4_ = 0x42b0c0a5;
                          auVar40 = auVar44._0_12_;
                        }
                        uVar33 = -(uint)(auVar40._0_4_ < -88.37626);
                        fVar34 = expf((float)(uVar33 & 0x42b0c0a5 | ~uVar33 & (uint)-auVar40._0_4_))
                        ;
                        fVar35 = 1.0 / (fVar34 + 1.0);
                        break;
                      case 5:
                        local_118 = auVar43;
                        fVar34 = expf(fVar34);
                        fVar34 = logf(fVar34 + 1.0);
                        fVar34 = tanhf(fVar34);
                        fVar35 = fVar34 * (float)local_118._0_4_;
                        break;
                      case 6:
                        pfVar8 = (float *)(this->activation_params).data;
                        fVar2 = *pfVar8;
                        fVar3 = pfVar8[1];
                        fVar36 = -fVar3 / fVar2;
                        fVar35 = 0.0;
                        if (fVar36 <= fVar34) {
                          if (fVar36 + 1.0 / fVar2 < fVar34) goto LAB_003f7847;
                          fVar35 = (fVar2 * fVar34 + fVar3) * fVar34;
                        }
                      }
                    }
                    else {
LAB_003f7847:
                      fVar35 = auVar43._0_4_;
                    }
                    if (local_19c < 0x65) {
                      *pfVar31 = fVar35;
                      lVar26 = 4;
                    }
                    else {
                      fVar34 = roundf(fVar35 * *(float *)((long)(this->top_blob_int8_scales).data +
                                                         local_1c0 * 4));
                      iVar16 = (int)fVar34;
                      if (iVar16 < -0x7e) {
                        iVar16 = -0x7f;
                      }
                      uVar15 = (undefined1)iVar16;
                      if (0x7e < iVar16) {
                        uVar15 = 0x7f;
                      }
                      *(undefined1 *)pfVar31 = uVar15;
                      lVar26 = 1;
                    }
                    pfVar31 = (float *)((long)pfVar31 + lVar26);
                    bVar32 = iVar20 != (int)local_140;
                    iVar20 = iVar20 + 1;
                  } while (bVar32);
                }
                iVar20 = (int)local_1b0;
                local_1b0 = (ulong)(iVar20 + 1);
              } while (iVar20 != (int)local_150);
            }
            local_130 = local_130 + 1;
          } while (local_130 != local_80);
        }
        local_1c0 = local_1c0 + 1;
        uVar24 = (ulong)local_11c;
      } while (local_1c0 < this->group);
    }
    iVar19 = 0;
  }
LAB_003f7a47:
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,(long)local_78.workspace_allocator - local_78._0_8_);
  }
LAB_003f7a69:
  piVar6 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (**(code **)(*(long *)local_198.allocator + 0x18))();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (**(code **)(*(long *)local_108.allocator + 0x18))();
      }
    }
  }
  return iVar19;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}